

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::~Electromagnetic_Emission_PDU
          (Electromagnetic_Emission_PDU *this)

{
  Electromagnetic_Emission_PDU *this_local;
  
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Electromagnetic_Emission_PDU_0032c500;
  std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
  clear(&this->m_vEmissionSystem);
  std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
  ~vector(&this->m_vEmissionSystem);
  DATA_TYPE::EntityIdentifier::~EntityIdentifier(&this->m_EventID);
  DATA_TYPE::EntityIdentifier::~EntityIdentifier(&this->m_EmittingEntityID);
  Header7::~Header7(&this->super_Header);
  return;
}

Assistant:

Electromagnetic_Emission_PDU::~Electromagnetic_Emission_PDU()
{
    m_vEmissionSystem.clear();
}